

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_char16_t_*>::Print(char16_t *str,ostream *os)

{
  allocator<char16_t> local_39;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_38;
  ostream *local_18;
  ostream *os_local;
  char16_t *str_local;
  
  local_18 = os;
  os_local = (ostream *)str;
  if (str == (char16_t *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::allocator<char16_t>::allocator(&local_39);
    std::__cxx11::u16string::u16string<std::allocator<char16_t>>
              ((u16string *)&local_38,str,&local_39);
    UniversalPrint<std::__cxx11::u16string>(&local_38,local_18);
    std::__cxx11::u16string::~u16string((u16string *)&local_38);
    std::allocator<char16_t>::~allocator(&local_39);
  }
  return;
}

Assistant:

static void Print(const char16_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::u16string(str), os);
    }
  }